

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panic.c
# Opt level: O3

void aura_print_stacktrace(void)

{
  int iVar1;
  void *__ptr;
  long lVar2;
  void *array [36];
  undefined1 auStack_148 [296];
  
  iVar1 = backtrace(auStack_148,0x24);
  __ptr = (void *)backtrace_symbols(auStack_148,iVar1);
  slog(0,4,"--- Dumping aura stack (%d entries) ---",(long)iVar1);
  if (iVar1 != 0) {
    lVar2 = 0;
    do {
      slog(0,4,"%s",*(undefined8 *)((long)__ptr + lVar2 * 8));
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  free(__ptr);
  return;
}

Assistant:

void aura_print_stacktrace()
{
	void *array[TRACE_LEN];
	size_t size;
	char **strings;
	size_t i;

	size = backtrace(array, TRACE_LEN);
	strings = backtrace_symbols(array, size);

	slog(0, SLOG_DEBUG, "--- Dumping aura stack (%d entries) ---", size);
	for (i = 0; i < size; i++)
		slog(0, SLOG_DEBUG, "%s", strings[i]);

	free(strings);
}